

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

double get_presentation_time(DECODER_MODEL *decoder_model,int display_index)

{
  double initial_presentation_delay;
  int display_index_local;
  DECODER_MODEL *decoder_model_local;
  double local_8;
  
  if (decoder_model->mode == '\x01') {
    local_8 = -1.0;
  }
  else if (0.0 <= decoder_model->initial_presentation_delay) {
    local_8 = (double)(display_index * decoder_model->num_ticks_per_picture) *
              decoder_model->display_clock_tick + decoder_model->initial_presentation_delay;
  }
  else {
    local_8 = -1.0;
  }
  return local_8;
}

Assistant:

static double get_presentation_time(const DECODER_MODEL *const decoder_model,
                                    int display_index) {
  if (decoder_model->mode == SCHEDULE_MODE) {
    assert(0 && "SCHEDULE_MODE NOT SUPPORTED");
    return INVALID_TIME;
  } else {
    const double initial_presentation_delay =
        decoder_model->initial_presentation_delay;
    // Can't decide presentation time until the initial presentation delay is
    // known.
    if (initial_presentation_delay < 0.0) return INVALID_TIME;

    return initial_presentation_delay +
           display_index * decoder_model->num_ticks_per_picture *
               decoder_model->display_clock_tick;
  }
}